

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::sse42::
     BVHNIntersector1<4,_1,_false,_embree::sse42::ArrayIntersector1<embree::sse42::TriangleMIntersector1Moeller<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar3;
  ulong uVar4;
  undefined8 uVar5;
  Geometry *pGVar6;
  RTCRayQueryContext *pRVar7;
  undefined1 auVar8 [16];
  undefined1 (*pauVar9) [16];
  int iVar10;
  undefined4 uVar11;
  undefined1 (*pauVar12) [16];
  undefined4 uVar14;
  int *piVar13;
  Scene *pSVar15;
  RayQueryContext *pRVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  int *piVar24;
  undefined1 (*pauVar25) [16];
  ulong unaff_R12;
  size_t mask;
  long lVar26;
  float fVar27;
  uint uVar28;
  float fVar37;
  float fVar39;
  vint4 bi;
  uint uVar38;
  uint uVar40;
  float fVar41;
  uint uVar42;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  float fVar43;
  float fVar46;
  vint4 bi_1;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  float fVar47;
  uint uVar48;
  float fVar49;
  float fVar51;
  uint uVar52;
  float fVar53;
  float fVar54;
  uint uVar55;
  float fVar56;
  vint4 ai;
  undefined1 auVar50 [16];
  float fVar57;
  uint uVar58;
  float fVar59;
  vint4 ai_1;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  float fVar62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  float fVar66;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  float fVar69;
  float fVar72;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  int local_117c;
  undefined8 local_1178;
  float fStack_1170;
  float fStack_116c;
  undefined1 local_1168 [16];
  RTCIntersectArguments *local_1150;
  float local_1148;
  float fStack_1144;
  float fStack_1140;
  float fStack_113c;
  RTCFilterFunctionNArguments local_1138;
  undefined1 local_1108 [16];
  Geometry *local_10f8;
  int *local_10f0;
  float local_10e8;
  undefined4 local_10e4;
  float local_10e0;
  float local_10dc;
  float local_10d8;
  undefined4 local_10d4;
  uint local_10d0;
  uint local_10cc;
  uint local_10c8;
  float local_10b8 [4];
  float local_10a8;
  float fStack_10a4;
  float fStack_10a0;
  float fStack_109c;
  undefined1 local_1098 [16];
  undefined1 local_1088 [16];
  undefined1 local_1068 [16];
  float local_1058 [4];
  float local_1048 [4];
  undefined1 local_1038 [16];
  undefined1 local_1028 [16];
  undefined1 local_1018 [16];
  float local_1008 [4];
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  uint local_f88;
  uint uStack_f84;
  uint uStack_f80;
  uint uStack_f7c;
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
    uStack_f70 = 0;
    if (local_f78 != 8) {
      pauVar25 = (undefined1 (*) [16])local_f68;
      fVar69 = *(float *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
      local_f98 = 0.0;
      if (0.0 <= fVar69) {
        local_f98 = fVar69;
      }
      local_fc8 = (ray->super_RayK<1>).org.field_0.m128[0];
      local_fd8 = (ray->super_RayK<1>).org.field_0.m128[1];
      local_fa8 = (ray->super_RayK<1>).org.field_0.m128[2];
      fVar69 = (ray->super_RayK<1>).tfar;
      fVar72 = 0.0;
      if (0.0 <= fVar69) {
        fVar72 = fVar69;
      }
      aVar3 = (ray->super_RayK<1>).dir.field_0.field_1;
      auVar50._4_4_ = -(uint)(ABS(aVar3.y) < DAT_01ff1d40._4_4_);
      auVar50._0_4_ = -(uint)(ABS(aVar3.x) < (float)DAT_01ff1d40);
      auVar50._8_4_ = -(uint)(ABS(aVar3.z) < DAT_01ff1d40._8_4_);
      auVar50._12_4_ = -(uint)(ABS(aVar3.field_3.w) < DAT_01ff1d40._12_4_);
      auVar50 = blendvps((undefined1  [16])aVar3,_DAT_01ff1d40,auVar50);
      auVar60 = rcpps(_DAT_01ff1d40,auVar50);
      local_fe8 = auVar60._0_4_;
      local_ff8 = auVar60._4_4_;
      local_fb8 = auVar60._8_4_;
      local_fe8 = (1.0 - auVar50._0_4_ * local_fe8) * local_fe8 + local_fe8;
      local_ff8 = (1.0 - auVar50._4_4_ * local_ff8) * local_ff8 + local_ff8;
      local_fb8 = (1.0 - auVar50._8_4_ * local_fb8) * local_fb8 + local_fb8;
      uVar20 = (ulong)(local_fe8 < 0.0) * 0x10;
      uVar21 = (ulong)(local_ff8 < 0.0) << 4 | 0x20;
      uVar22 = (ulong)(local_fb8 < 0.0) << 4 | 0x40;
      _local_f88 = mm_lookupmask_ps._240_8_;
      _uStack_f80 = mm_lookupmask_ps._248_8_;
      fStack_f94 = local_f98;
      fStack_f90 = local_f98;
      fStack_f8c = local_f98;
      fStack_fa4 = local_fa8;
      fStack_fa0 = local_fa8;
      fStack_f9c = local_fa8;
      fStack_fb4 = local_fb8;
      fStack_fb0 = local_fb8;
      fStack_fac = local_fb8;
      fStack_fc4 = local_fc8;
      fStack_fc0 = local_fc8;
      fStack_fbc = local_fc8;
      fStack_fd4 = local_fd8;
      fStack_fd0 = local_fd8;
      fStack_fcc = local_fd8;
      fStack_fe4 = local_fe8;
      fStack_fe0 = local_fe8;
      fStack_fdc = local_fe8;
      fStack_ff4 = local_ff8;
      fStack_ff0 = local_ff8;
      fStack_fec = local_ff8;
      local_1178 = context;
      fVar69 = local_f98;
      fVar49 = local_f98;
      fVar53 = local_f98;
      fVar56 = local_f98;
      fVar59 = local_fa8;
      fVar74 = local_fa8;
      fVar75 = local_fa8;
      fVar76 = local_fa8;
      fVar77 = local_fb8;
      fVar78 = local_fb8;
      fVar79 = local_fb8;
      fVar80 = local_fb8;
      fVar82 = local_fc8;
      fVar84 = local_fc8;
      fVar86 = local_fc8;
      fVar88 = local_fc8;
      fVar90 = local_fd8;
      fVar91 = local_fd8;
      fVar92 = local_fd8;
      fVar66 = local_fd8;
      fVar98 = local_fe8;
      fVar73 = local_fe8;
      fVar95 = local_fe8;
      fVar97 = local_fe8;
      fVar99 = local_ff8;
      fVar101 = local_ff8;
      fVar103 = local_ff8;
      fVar105 = local_ff8;
      fVar43 = fVar72;
      fVar46 = fVar72;
      fVar62 = fVar72;
      do {
        do {
          do {
            pauVar12 = (undefined1 (*) [16])&local_f78;
            if (pauVar25 == pauVar12) {
              return;
            }
            pauVar9 = pauVar25 + -1;
            pauVar25 = pauVar25 + -1;
          } while ((ray->super_RayK<1>).tfar < *(float *)((long)*pauVar9 + 8));
          uVar18 = *(ulong *)*pauVar25;
          do {
            if ((uVar18 & 8) == 0) {
              pfVar1 = (float *)(uVar18 + 0x20 + uVar20);
              fVar27 = (*pfVar1 - fVar82) * fVar98;
              fVar37 = (pfVar1[1] - fVar84) * fVar73;
              fVar39 = (pfVar1[2] - fVar86) * fVar95;
              fVar41 = (pfVar1[3] - fVar88) * fVar97;
              pfVar1 = (float *)(uVar18 + 0x20 + uVar21);
              fVar47 = (*pfVar1 - fVar90) * fVar99;
              fVar51 = (pfVar1[1] - fVar91) * fVar101;
              fVar54 = (pfVar1[2] - fVar92) * fVar103;
              fVar57 = (pfVar1[3] - fVar66) * fVar105;
              uVar48 = (uint)((int)fVar47 < (int)fVar27) * (int)fVar27 |
                       (uint)((int)fVar47 >= (int)fVar27) * (int)fVar47;
              uVar52 = (uint)((int)fVar51 < (int)fVar37) * (int)fVar37 |
                       (uint)((int)fVar51 >= (int)fVar37) * (int)fVar51;
              uVar55 = (uint)((int)fVar54 < (int)fVar39) * (int)fVar39 |
                       (uint)((int)fVar54 >= (int)fVar39) * (int)fVar54;
              uVar58 = (uint)((int)fVar57 < (int)fVar41) * (int)fVar41 |
                       (uint)((int)fVar57 >= (int)fVar41) * (int)fVar57;
              pfVar1 = (float *)(uVar18 + 0x20 + uVar22);
              fVar27 = (*pfVar1 - fVar59) * fVar77;
              fVar37 = (pfVar1[1] - fVar74) * fVar78;
              fVar39 = (pfVar1[2] - fVar75) * fVar79;
              fVar41 = (pfVar1[3] - fVar76) * fVar80;
              uVar28 = (uint)((int)fVar27 < (int)fVar69) * (int)fVar69 |
                       (uint)((int)fVar27 >= (int)fVar69) * (int)fVar27;
              uVar38 = (uint)((int)fVar37 < (int)fVar49) * (int)fVar49 |
                       (uint)((int)fVar37 >= (int)fVar49) * (int)fVar37;
              uVar40 = (uint)((int)fVar39 < (int)fVar53) * (int)fVar53 |
                       (uint)((int)fVar39 >= (int)fVar53) * (int)fVar39;
              uVar42 = (uint)((int)fVar41 < (int)fVar56) * (int)fVar56 |
                       (uint)((int)fVar41 >= (int)fVar56) * (int)fVar41;
              local_10b8[0] =
                   (float)(((int)uVar28 < (int)uVar48) * uVar48 |
                          ((int)uVar28 >= (int)uVar48) * uVar28);
              local_10b8[1] =
                   (float)(((int)uVar38 < (int)uVar52) * uVar52 |
                          ((int)uVar38 >= (int)uVar52) * uVar38);
              local_10b8[2] =
                   (float)(((int)uVar40 < (int)uVar55) * uVar55 |
                          ((int)uVar40 >= (int)uVar55) * uVar40);
              local_10b8[3] =
                   (float)(((int)uVar42 < (int)uVar58) * uVar58 |
                          ((int)uVar42 >= (int)uVar58) * uVar42);
              pfVar1 = (float *)(uVar18 + 0x20 + (uVar20 ^ 0x10));
              fVar27 = (*pfVar1 - fVar82) * fVar98;
              fVar37 = (pfVar1[1] - fVar84) * fVar73;
              fVar39 = (pfVar1[2] - fVar86) * fVar95;
              fVar41 = (pfVar1[3] - fVar88) * fVar97;
              pfVar1 = (float *)(uVar18 + 0x20 + (uVar21 ^ 0x10));
              fVar47 = (*pfVar1 - fVar90) * fVar99;
              fVar51 = (pfVar1[1] - fVar91) * fVar101;
              fVar54 = (pfVar1[2] - fVar92) * fVar103;
              fVar57 = (pfVar1[3] - fVar66) * fVar105;
              uVar48 = (uint)((int)fVar27 < (int)fVar47) * (int)fVar27 |
                       (uint)((int)fVar27 >= (int)fVar47) * (int)fVar47;
              uVar52 = (uint)((int)fVar37 < (int)fVar51) * (int)fVar37 |
                       (uint)((int)fVar37 >= (int)fVar51) * (int)fVar51;
              uVar55 = (uint)((int)fVar39 < (int)fVar54) * (int)fVar39 |
                       (uint)((int)fVar39 >= (int)fVar54) * (int)fVar54;
              uVar58 = (uint)((int)fVar41 < (int)fVar57) * (int)fVar41 |
                       (uint)((int)fVar41 >= (int)fVar57) * (int)fVar57;
              pfVar1 = (float *)(uVar18 + 0x20 + (uVar22 ^ 0x10));
              fVar27 = (*pfVar1 - fVar59) * fVar77;
              fVar37 = (pfVar1[1] - fVar74) * fVar78;
              fVar39 = (pfVar1[2] - fVar75) * fVar79;
              fVar41 = (pfVar1[3] - fVar76) * fVar80;
              uVar28 = (uint)((int)fVar72 < (int)fVar27) * (int)fVar72 |
                       (uint)((int)fVar72 >= (int)fVar27) * (int)fVar27;
              uVar38 = (uint)((int)fVar43 < (int)fVar37) * (int)fVar43 |
                       (uint)((int)fVar43 >= (int)fVar37) * (int)fVar37;
              uVar40 = (uint)((int)fVar46 < (int)fVar39) * (int)fVar46 |
                       (uint)((int)fVar46 >= (int)fVar39) * (int)fVar39;
              uVar42 = (uint)((int)fVar62 < (int)fVar41) * (int)fVar62 |
                       (uint)((int)fVar62 >= (int)fVar41) * (int)fVar41;
              auVar60._0_4_ =
                   -(uint)((int)(((int)uVar48 < (int)uVar28) * uVar48 |
                                ((int)uVar48 >= (int)uVar28) * uVar28) < (int)local_10b8[0]);
              auVar60._4_4_ =
                   -(uint)((int)(((int)uVar52 < (int)uVar38) * uVar52 |
                                ((int)uVar52 >= (int)uVar38) * uVar38) < (int)local_10b8[1]);
              auVar60._8_4_ =
                   -(uint)((int)(((int)uVar55 < (int)uVar40) * uVar55 |
                                ((int)uVar55 >= (int)uVar40) * uVar40) < (int)local_10b8[2]);
              auVar60._12_4_ =
                   -(uint)((int)(((int)uVar58 < (int)uVar42) * uVar58 |
                                ((int)uVar58 >= (int)uVar42) * uVar42) < (int)local_10b8[3]);
              uVar28 = movmskps((int)pauVar12,auVar60);
              unaff_R12 = ((ulong)uVar28 ^ 0xf) & 0xff;
            }
            if ((uVar18 & 8) == 0) {
              if (unaff_R12 == 0) {
                pauVar12 = (undefined1 (*) [16])0x4;
              }
              else {
                uVar17 = uVar18 & 0xfffffffffffffff0;
                lVar19 = 0;
                if (unaff_R12 != 0) {
                  for (; (unaff_R12 >> lVar19 & 1) == 0; lVar19 = lVar19 + 1) {
                  }
                }
                pauVar12 = (undefined1 (*) [16])0x0;
                uVar18 = *(ulong *)(uVar17 + lVar19 * 8);
                uVar23 = unaff_R12 - 1 & unaff_R12;
                if (uVar23 != 0) {
                  fVar27 = local_10b8[lVar19];
                  lVar19 = 0;
                  if (uVar23 != 0) {
                    for (; (uVar23 >> lVar19 & 1) == 0; lVar19 = lVar19 + 1) {
                    }
                  }
                  uVar4 = *(ulong *)(uVar17 + lVar19 * 8);
                  fVar37 = local_10b8[lVar19];
                  uVar23 = uVar23 - 1 & uVar23;
                  if (uVar23 == 0) {
                    if ((uint)fVar27 < (uint)fVar37) {
                      *(ulong *)*pauVar25 = uVar4;
                      *(float *)((long)*pauVar25 + 8) = fVar37;
                      pauVar25 = pauVar25 + 1;
                    }
                    else {
                      *(ulong *)*pauVar25 = uVar18;
                      *(float *)((long)*pauVar25 + 8) = fVar27;
                      uVar18 = uVar4;
                      pauVar25 = pauVar25 + 1;
                    }
                  }
                  else {
                    auVar64._8_4_ = fVar27;
                    auVar64._0_8_ = uVar18;
                    auVar64._12_4_ = 0;
                    auVar68._8_4_ = fVar37;
                    auVar68._0_8_ = uVar4;
                    auVar68._12_4_ = 0;
                    lVar19 = 0;
                    if (uVar23 != 0) {
                      for (; (uVar23 >> lVar19 & 1) == 0; lVar19 = lVar19 + 1) {
                      }
                    }
                    uVar5 = *(undefined8 *)(uVar17 + lVar19 * 8);
                    fVar39 = local_10b8[lVar19];
                    auVar71._8_4_ = fVar39;
                    auVar71._0_8_ = uVar5;
                    auVar71._12_4_ = 0;
                    auVar65._8_4_ = -(uint)((int)fVar27 < (int)fVar37);
                    uVar23 = uVar23 - 1 & uVar23;
                    if (uVar23 == 0) {
                      auVar65._4_4_ = auVar65._8_4_;
                      auVar65._0_4_ = auVar65._8_4_;
                      auVar65._12_4_ = auVar65._8_4_;
                      auVar63._8_4_ = fVar37;
                      auVar63._0_8_ = uVar4;
                      auVar63._12_4_ = 0;
                      auVar60 = blendvps(auVar63,auVar64,auVar65);
                      auVar50 = blendvps(auVar64,auVar68,auVar65);
                      auVar29._8_4_ = -(uint)(auVar60._8_4_ < (int)fVar39);
                      auVar29._4_4_ = auVar29._8_4_;
                      auVar29._0_4_ = auVar29._8_4_;
                      auVar29._12_4_ = auVar29._8_4_;
                      auVar67._8_4_ = fVar39;
                      auVar67._0_8_ = uVar5;
                      auVar67._12_4_ = 0;
                      auVar68 = blendvps(auVar67,auVar60,auVar29);
                      auVar64 = blendvps(auVar60,auVar71,auVar29);
                      auVar30._8_4_ = -(uint)(auVar50._8_4_ < auVar64._8_4_);
                      auVar30._4_4_ = auVar30._8_4_;
                      auVar30._0_4_ = auVar30._8_4_;
                      auVar30._12_4_ = auVar30._8_4_;
                      auVar60 = blendvps(auVar64,auVar50,auVar30);
                      auVar50 = blendvps(auVar50,auVar64,auVar30);
                      *pauVar25 = auVar50;
                      pauVar25[1] = auVar60;
                      uVar18 = auVar68._0_8_;
                      pauVar25 = pauVar25 + 2;
                    }
                    else {
                      lVar19 = 0;
                      if (uVar23 != 0) {
                        for (; (uVar23 >> lVar19 & 1) == 0; lVar19 = lVar19 + 1) {
                        }
                      }
                      auVar31._4_4_ = auVar65._8_4_;
                      auVar31._0_4_ = auVar65._8_4_;
                      auVar31._8_4_ = auVar65._8_4_;
                      auVar31._12_4_ = auVar65._8_4_;
                      auVar65 = blendvps(auVar68,auVar64,auVar31);
                      auVar50 = blendvps(auVar64,auVar68,auVar31);
                      auVar70._8_4_ = local_10b8[lVar19];
                      auVar70._0_8_ = *(undefined8 *)(uVar17 + lVar19 * 8);
                      auVar70._12_4_ = 0;
                      auVar32._8_4_ = -(uint)((int)fVar39 < (int)local_10b8[lVar19]);
                      auVar32._4_4_ = auVar32._8_4_;
                      auVar32._0_4_ = auVar32._8_4_;
                      auVar32._12_4_ = auVar32._8_4_;
                      auVar64 = blendvps(auVar70,auVar71,auVar32);
                      auVar60 = blendvps(auVar71,auVar70,auVar32);
                      auVar33._8_4_ = -(uint)(auVar50._8_4_ < auVar60._8_4_);
                      auVar33._4_4_ = auVar33._8_4_;
                      auVar33._0_4_ = auVar33._8_4_;
                      auVar33._12_4_ = auVar33._8_4_;
                      auVar71 = blendvps(auVar60,auVar50,auVar33);
                      auVar50 = blendvps(auVar50,auVar60,auVar33);
                      auVar34._8_4_ = -(uint)(auVar65._8_4_ < auVar64._8_4_);
                      auVar34._4_4_ = auVar34._8_4_;
                      auVar34._0_4_ = auVar34._8_4_;
                      auVar34._12_4_ = auVar34._8_4_;
                      auVar60 = blendvps(auVar64,auVar65,auVar34);
                      auVar64 = blendvps(auVar65,auVar64,auVar34);
                      auVar35._8_4_ = -(uint)(auVar64._8_4_ < auVar71._8_4_);
                      auVar35._4_4_ = auVar35._8_4_;
                      auVar35._0_4_ = auVar35._8_4_;
                      auVar35._12_4_ = auVar35._8_4_;
                      auVar68 = blendvps(auVar71,auVar64,auVar35);
                      auVar64 = blendvps(auVar64,auVar71,auVar35);
                      *pauVar25 = auVar50;
                      pauVar25[1] = auVar64;
                      pauVar25[2] = auVar68;
                      uVar18 = auVar60._0_8_;
                      pauVar25 = pauVar25 + 3;
                    }
                  }
                }
              }
            }
            else {
              pauVar12 = (undefined1 (*) [16])0x6;
            }
          } while ((int)pauVar12 == 0);
        } while ((int)pauVar12 != 6);
        uVar17 = (ulong)((uint)uVar18 & 0xf);
        if (uVar17 != 8) {
          uVar18 = uVar18 & 0xfffffffffffffff0;
          lVar19 = 0;
          pRVar16 = local_1178;
          do {
            lVar26 = lVar19 * 0xb0;
            pfVar1 = (float *)(uVar18 + 0x80 + lVar26);
            fVar69 = *pfVar1;
            fVar72 = pfVar1[1];
            fVar49 = pfVar1[2];
            fVar53 = pfVar1[3];
            pfVar1 = (float *)(uVar18 + 0x40 + lVar26);
            fVar56 = *pfVar1;
            fVar59 = pfVar1[1];
            fVar74 = pfVar1[2];
            fVar75 = pfVar1[3];
            pfVar1 = (float *)(uVar18 + 0x70 + lVar26);
            fVar76 = *pfVar1;
            fVar77 = pfVar1[1];
            fVar78 = pfVar1[2];
            fVar79 = pfVar1[3];
            pfVar1 = (float *)(uVar18 + 0x50 + lVar26);
            fVar80 = *pfVar1;
            fVar82 = pfVar1[1];
            fVar84 = pfVar1[2];
            fVar86 = pfVar1[3];
            local_1148 = fVar76 * fVar80 - fVar69 * fVar56;
            fStack_1144 = fVar77 * fVar82 - fVar72 * fVar59;
            fStack_1140 = fVar78 * fVar84 - fVar49 * fVar74;
            fStack_113c = fVar79 * fVar86 - fVar53 * fVar75;
            pfVar1 = (float *)(uVar18 + 0x60 + lVar26);
            fVar88 = *pfVar1;
            fVar90 = pfVar1[1];
            fVar91 = pfVar1[2];
            fVar92 = pfVar1[3];
            pfVar1 = (float *)(uVar18 + lVar26);
            pfVar2 = (float *)(uVar18 + 0x10 + lVar26);
            fStack_116c = (ray->super_RayK<1>).org.field_0.m128[0];
            fVar66 = (ray->super_RayK<1>).org.field_0.m128[1];
            fVar98 = (ray->super_RayK<1>).org.field_0.m128[2];
            fVar73 = (ray->super_RayK<1>).dir.field_0.m128[0];
            fVar95 = (ray->super_RayK<1>).dir.field_0.m128[1];
            fVar97 = (ray->super_RayK<1>).dir.field_0.m128[2];
            fVar43 = *pfVar1 - fStack_116c;
            fVar46 = pfVar1[1] - fStack_116c;
            fStack_1170 = pfVar1[2] - fStack_116c;
            fStack_116c = pfVar1[3] - fStack_116c;
            fVar62 = *pfVar2 - fVar66;
            fVar27 = pfVar2[1] - fVar66;
            fVar37 = pfVar2[2] - fVar66;
            fVar66 = pfVar2[3] - fVar66;
            fVar100 = fVar43 * fVar95 - fVar73 * fVar62;
            fVar102 = fVar46 * fVar95 - fVar73 * fVar27;
            fVar104 = fStack_1170 * fVar95 - fVar73 * fVar37;
            fVar106 = fStack_116c * fVar95 - fVar73 * fVar66;
            pfVar1 = (float *)(uVar18 + 0x30 + lVar26);
            fVar99 = *pfVar1;
            fVar101 = pfVar1[1];
            fVar103 = pfVar1[2];
            fVar105 = pfVar1[3];
            local_1018._0_4_ = fVar69 * fVar99 - fVar80 * fVar88;
            local_1018._4_4_ = fVar72 * fVar101 - fVar82 * fVar90;
            local_1018._8_4_ = fVar49 * fVar103 - fVar84 * fVar91;
            local_1018._12_4_ = fVar53 * fVar105 - fVar86 * fVar92;
            pfVar1 = (float *)(uVar18 + 0x20 + lVar26);
            fVar93 = *pfVar1 - fVar98;
            fVar94 = pfVar1[1] - fVar98;
            fVar96 = pfVar1[2] - fVar98;
            fVar98 = pfVar1[3] - fVar98;
            local_1178 = (RayQueryContext *)CONCAT44(fVar46,fVar43);
            fVar83 = fVar73 * fVar93 - fVar43 * fVar97;
            fVar85 = fVar73 * fVar94 - fVar46 * fVar97;
            fVar87 = fVar73 * fVar96 - fStack_1170 * fVar97;
            fVar89 = fVar73 * fVar98 - fStack_116c * fVar97;
            local_1008[0] = fVar56 * fVar88 - fVar76 * fVar99;
            local_1008[1] = fVar59 * fVar90 - fVar77 * fVar101;
            local_1008[2] = fVar74 * fVar91 - fVar78 * fVar103;
            local_1008[3] = fVar75 * fVar92 - fVar79 * fVar105;
            fVar51 = fVar97 * fVar62 - fVar95 * fVar93;
            fVar54 = fVar97 * fVar27 - fVar95 * fVar94;
            fVar57 = fVar97 * fVar37 - fVar95 * fVar96;
            fVar81 = fVar97 * fVar66 - fVar95 * fVar98;
            fVar39 = fVar95 * local_1018._0_4_ + fVar97 * local_1008[0] + local_1148 * fVar73;
            fVar41 = fVar95 * local_1018._4_4_ + fVar97 * local_1008[1] + fStack_1144 * fVar73;
            fVar47 = fVar95 * local_1018._8_4_ + fVar97 * local_1008[2] + fStack_1140 * fVar73;
            fVar73 = fVar95 * local_1018._12_4_ + fVar97 * local_1008[3] + fStack_113c * fVar73;
            uVar28 = (uint)fVar39 & 0x80000000;
            uVar38 = (uint)fVar41 & 0x80000000;
            uVar40 = (uint)fVar47 & 0x80000000;
            uVar42 = (uint)fVar73 & 0x80000000;
            local_10b8[0] =
                 (float)((uint)(fVar88 * fVar51 + fVar76 * fVar83 + fVar69 * fVar100) ^ uVar28);
            local_10b8[1] =
                 (float)((uint)(fVar90 * fVar54 + fVar77 * fVar85 + fVar72 * fVar102) ^ uVar38);
            local_10b8[2] =
                 (float)((uint)(fVar91 * fVar57 + fVar78 * fVar87 + fVar49 * fVar104) ^ uVar40);
            local_10b8[3] =
                 (float)((uint)(fVar92 * fVar81 + fVar79 * fVar89 + fVar53 * fVar106) ^ uVar42);
            local_10a8 = (float)((uint)(fVar51 * fVar99 + fVar83 * fVar56 + fVar100 * fVar80) ^
                                uVar28);
            fStack_10a4 = (float)((uint)(fVar54 * fVar101 + fVar85 * fVar59 + fVar102 * fVar82) ^
                                 uVar38);
            fStack_10a0 = (float)((uint)(fVar57 * fVar103 + fVar87 * fVar74 + fVar104 * fVar84) ^
                                 uVar40);
            fStack_109c = (float)((uint)(fVar81 * fVar105 + fVar89 * fVar75 + fVar106 * fVar86) ^
                                 uVar42);
            fVar69 = ABS(fVar39);
            fVar72 = ABS(fVar41);
            local_1088._0_8_ = CONCAT44(fVar41,fVar39) & 0x7fffffff7fffffff;
            local_1088._8_4_ = ABS(fVar47);
            local_1088._12_4_ = ABS(fVar73);
            uVar48 = -(uint)(local_10b8[0] + local_10a8 <= fVar69) &
                     -(uint)((0.0 <= local_10a8 && 0.0 <= local_10b8[0]) && fVar39 != 0.0) &
                     local_f88;
            uVar52 = -(uint)(local_10b8[1] + fStack_10a4 <= fVar72) &
                     -(uint)((0.0 <= fStack_10a4 && 0.0 <= local_10b8[1]) && fVar41 != 0.0) &
                     uStack_f84;
            uVar55 = -(uint)(local_10b8[2] + fStack_10a0 <= local_1088._8_4_) &
                     -(uint)((0.0 <= fStack_10a0 && 0.0 <= local_10b8[2]) && fVar47 != 0.0) &
                     uStack_f80;
            uVar58 = -(uint)(local_10b8[3] + fStack_109c <= local_1088._12_4_) &
                     -(uint)((0.0 <= fStack_109c && 0.0 <= local_10b8[3]) && fVar73 != 0.0) &
                     uStack_f7c;
            uVar14 = (undefined4)((ulong)pauVar12 >> 0x20);
            auVar8._4_4_ = uVar52;
            auVar8._0_4_ = uVar48;
            auVar8._8_4_ = uVar55;
            auVar8._12_4_ = uVar58;
            iVar10 = movmskps((int)pauVar12,auVar8);
            pauVar12 = (undefined1 (*) [16])CONCAT44(uVar14,iVar10);
            local_1178 = pRVar16;
            if (iVar10 != 0) {
              local_1098._0_4_ =
                   (float)(uVar28 ^ (uint)(fVar43 * local_1148 +
                                          fVar62 * local_1018._0_4_ + fVar93 * local_1008[0]));
              local_1098._4_4_ =
                   (float)(uVar38 ^ (uint)(fVar46 * fStack_1144 +
                                          fVar27 * local_1018._4_4_ + fVar94 * local_1008[1]));
              local_1098._8_4_ =
                   (float)(uVar40 ^ (uint)(fStack_1170 * fStack_1140 +
                                          fVar37 * local_1018._8_4_ + fVar96 * local_1008[2]));
              local_1098._12_4_ =
                   (float)(uVar42 ^ (uint)(fStack_116c * fStack_113c +
                                          fVar66 * local_1018._12_4_ + fVar98 * local_1008[3]));
              fVar49 = (ray->super_RayK<1>).org.field_0.m128[3];
              fVar53 = (ray->super_RayK<1>).tfar;
              auVar36._0_4_ =
                   -(uint)(local_1098._0_4_ <= fVar53 * fVar69 && fVar49 * fVar69 < local_1098._0_4_
                          ) & uVar48;
              auVar36._4_4_ =
                   -(uint)(local_1098._4_4_ <= fVar53 * fVar72 && fVar49 * fVar72 < local_1098._4_4_
                          ) & uVar52;
              auVar36._8_4_ =
                   -(uint)(local_1098._8_4_ <= fVar53 * local_1088._8_4_ &&
                          fVar49 * local_1088._8_4_ < local_1098._8_4_) & uVar55;
              auVar36._12_4_ =
                   -(uint)(local_1098._12_4_ <= fVar53 * local_1088._12_4_ &&
                          fVar49 * local_1088._12_4_ < local_1098._12_4_) & uVar58;
              iVar10 = movmskps(iVar10,auVar36);
              pauVar12 = (undefined1 (*) [16])CONCAT44(uVar14,iVar10);
              if (iVar10 != 0) {
                local_1068 = auVar36;
                local_1028._4_4_ = fStack_1144;
                local_1028._0_4_ = local_1148;
                local_1028._8_4_ = fStack_1140;
                local_1028._12_4_ = fStack_113c;
                pSVar15 = pRVar16->scene;
                auVar50 = rcpps(local_1028,local_1088);
                fVar49 = auVar50._0_4_;
                fVar53 = auVar50._4_4_;
                fVar56 = auVar50._8_4_;
                fVar59 = auVar50._12_4_;
                fVar49 = (1.0 - fVar69 * fVar49) * fVar49 + fVar49;
                fVar53 = (1.0 - fVar72 * fVar53) * fVar53 + fVar53;
                fVar56 = (1.0 - local_1088._8_4_ * fVar56) * fVar56 + fVar56;
                fVar59 = (1.0 - local_1088._12_4_ * fVar59) * fVar59 + fVar59;
                local_1038._0_4_ = local_1098._0_4_ * fVar49;
                local_1038._4_4_ = local_1098._4_4_ * fVar53;
                local_1038._8_4_ = local_1098._8_4_ * fVar56;
                local_1038._12_4_ = local_1098._12_4_ * fVar59;
                local_1058[0] = local_10b8[0] * fVar49;
                local_1058[1] = local_10b8[1] * fVar53;
                local_1058[2] = local_10b8[2] * fVar56;
                local_1058[3] = local_10b8[3] * fVar59;
                local_1168 = auVar36;
                local_1048[0] = fVar49 * local_10a8;
                local_1048[1] = fVar53 * fStack_10a4;
                local_1048[2] = fVar56 * fStack_10a0;
                local_1048[3] = fVar59 * fStack_109c;
                auVar60 = blendvps(_DAT_01feb9f0,local_1038,auVar36);
                auVar61._4_4_ = auVar60._0_4_;
                auVar61._0_4_ = auVar60._4_4_;
                auVar61._8_4_ = auVar60._12_4_;
                auVar61._12_4_ = auVar60._8_4_;
                auVar50 = minps(auVar61,auVar60);
                auVar44._0_8_ = auVar50._8_8_;
                auVar44._8_4_ = auVar50._0_4_;
                auVar44._12_4_ = auVar50._4_4_;
                auVar50 = minps(auVar44,auVar50);
                auVar45._0_8_ =
                     CONCAT44(-(uint)(auVar50._4_4_ == auVar60._4_4_) & auVar36._4_4_,
                              -(uint)(auVar50._0_4_ == auVar60._0_4_) & auVar36._0_4_);
                auVar45._8_4_ = -(uint)(auVar50._8_4_ == auVar60._8_4_) & auVar36._8_4_;
                auVar45._12_4_ = -(uint)(auVar50._12_4_ == auVar60._12_4_) & auVar36._12_4_;
                iVar10 = movmskps(iVar10,auVar45);
                if (iVar10 != 0) {
                  auVar36._8_4_ = auVar45._8_4_;
                  auVar36._0_8_ = auVar45._0_8_;
                  auVar36._12_4_ = auVar45._12_4_;
                }
                lVar26 = lVar26 + uVar18;
                uVar11 = movmskps(iVar10,auVar36);
                piVar24 = (int *)0x0;
                if (CONCAT44(uVar14,uVar11) != 0) {
                  for (; (CONCAT44(uVar14,uVar11) >> (long)piVar24 & 1) == 0;
                      piVar24 = (int *)((long)piVar24 + 1)) {
                  }
                }
                local_1148 = SUB84(pSVar15,0);
                fStack_1144 = (float)((ulong)pSVar15 >> 0x20);
                auVar50 = local_1038;
                do {
                  uVar28 = *(uint *)(lVar26 + 0x90 + (long)piVar24 * 4);
                  piVar13 = (int *)(ulong)uVar28;
                  pGVar6 = (pSVar15->geometries).items[(long)piVar13].ptr;
                  if ((pGVar6->mask & (ray->super_RayK<1>).mask) == 0) {
                    *(undefined4 *)(local_1168 + (long)piVar24 * 4) = 0;
                  }
                  else {
                    if ((local_1178->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      fVar69 = local_1058[(long)piVar24];
                      fVar72 = local_1048[(long)piVar24];
                      (ray->super_RayK<1>).tfar = *(float *)(local_1038 + (long)piVar24 * 4);
                      (ray->Ng).field_0.field_0.x = *(float *)(local_1028 + (long)piVar24 * 4);
                      (ray->Ng).field_0.field_0.y = *(float *)(local_1018 + (long)piVar24 * 4);
                      (ray->Ng).field_0.field_0.z = local_1008[(long)piVar24];
                      ray->u = fVar69;
                      ray->v = fVar72;
                      ray->primID = *(uint *)(lVar26 + 0xa0 + (long)piVar24 * 4);
                      ray->geomID = uVar28;
                      pRVar7 = local_1178->user;
                      ray->instID[0] = pRVar7->instID[0];
                      uVar28 = pRVar7->instPrimID[0];
                      pauVar12 = (undefined1 (*) [16])(ulong)uVar28;
                      ray->instPrimID[0] = uVar28;
                      break;
                    }
                    local_1150 = local_1178->args;
                    local_1108 = auVar50;
                    local_1138.context = local_1178->user;
                    local_10e8 = *(float *)(local_1028 + (long)piVar24 * 4);
                    local_10e4 = *(undefined4 *)(local_1018 + (long)piVar24 * 4);
                    local_10e0 = local_1008[(long)piVar24];
                    local_10dc = local_1058[(long)piVar24];
                    local_10d8 = local_1048[(long)piVar24];
                    local_10d4 = *(undefined4 *)(lVar26 + 0xa0 + (long)piVar24 * 4);
                    local_10d0 = uVar28;
                    local_10cc = (local_1138.context)->instID[0];
                    local_10c8 = (local_1138.context)->instPrimID[0];
                    fVar69 = (ray->super_RayK<1>).tfar;
                    local_10f0 = piVar24;
                    (ray->super_RayK<1>).tfar = *(float *)(local_1038 + (long)piVar24 * 4);
                    local_117c = -1;
                    local_1138.valid = &local_117c;
                    local_1138.geometryUserPtr = pGVar6->userPtr;
                    local_1138.ray = (RTCRayN *)ray;
                    local_1138.hit = (RTCHitN *)&local_10e8;
                    local_1138.N = 1;
                    local_10f8 = pGVar6;
                    if ((pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                       ((*pGVar6->intersectionFilterN)(&local_1138), *local_1138.valid != 0)) {
                      if (local_1150->filter != (RTCFilterFunctionN)0x0) {
                        if (((local_1150->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                           (((local_10f8->field_8).field_0x2 & 0x40) != 0)) {
                          (*local_1150->filter)(&local_1138);
                        }
                        if (*local_1138.valid == 0) goto LAB_00e71d6d;
                      }
                      (((Vec3f *)((long)local_1138.ray + 0x30))->field_0).field_0.x =
                           *(float *)local_1138.hit;
                      (((Vec3f *)((long)local_1138.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_1138.hit + 4);
                      (((Vec3f *)((long)local_1138.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_1138.hit + 8);
                      *(float *)((long)local_1138.ray + 0x3c) = *(float *)(local_1138.hit + 0xc);
                      *(float *)((long)local_1138.ray + 0x40) = *(float *)(local_1138.hit + 0x10);
                      *(float *)((long)local_1138.ray + 0x44) = *(float *)(local_1138.hit + 0x14);
                      *(float *)((long)local_1138.ray + 0x48) = *(float *)(local_1138.hit + 0x18);
                      *(float *)((long)local_1138.ray + 0x4c) = *(float *)(local_1138.hit + 0x1c);
                      *(float *)((long)local_1138.ray + 0x50) = *(float *)(local_1138.hit + 0x20);
                    }
                    else {
LAB_00e71d6d:
                      (ray->super_RayK<1>).tfar = fVar69;
                    }
                    piVar13 = local_10f0;
                    *(undefined4 *)(local_1168 + (long)local_10f0 * 4) = 0;
                    fVar69 = (ray->super_RayK<1>).tfar;
                    local_1168._4_4_ = -(uint)(local_1108._4_4_ <= fVar69) & local_1168._4_4_;
                    local_1168._0_4_ = -(uint)(local_1108._0_4_ <= fVar69) & local_1168._0_4_;
                    local_1168._8_4_ = -(uint)(local_1108._8_4_ <= fVar69) & local_1168._8_4_;
                    local_1168._12_4_ = -(uint)(local_1108._12_4_ <= fVar69) & local_1168._12_4_;
                    auVar50 = local_1108;
                  }
                  iVar10 = movmskps((int)piVar13,local_1168);
                  pauVar12 = (undefined1 (*) [16])CONCAT44((int)((ulong)piVar13 >> 0x20),iVar10);
                  if (iVar10 == 0) break;
                  local_1108 = auVar50;
                  BVHNIntersector1<4,1,false,embree::sse42::ArrayIntersector1<embree::sse42::TriangleMIntersector1Moeller<4,true>>>
                  ::intersect();
                  pSVar15 = (Scene *)CONCAT44(fStack_1144,local_1148);
                  piVar24 = local_1138.valid;
                  auVar50 = local_1108;
                } while( true );
              }
            }
            lVar19 = lVar19 + 1;
            pRVar16 = local_1178;
          } while (lVar19 != uVar17 - 8);
        }
        fVar72 = (ray->super_RayK<1>).tfar;
        fVar69 = local_f98;
        fVar49 = fStack_f94;
        fVar53 = fStack_f90;
        fVar56 = fStack_f8c;
        fVar59 = local_fa8;
        fVar74 = fStack_fa4;
        fVar75 = fStack_fa0;
        fVar76 = fStack_f9c;
        fVar77 = local_fb8;
        fVar78 = fStack_fb4;
        fVar79 = fStack_fb0;
        fVar80 = fStack_fac;
        fVar82 = local_fc8;
        fVar84 = fStack_fc4;
        fVar86 = fStack_fc0;
        fVar88 = fStack_fbc;
        fVar90 = local_fd8;
        fVar91 = fStack_fd4;
        fVar92 = fStack_fd0;
        fVar66 = fStack_fcc;
        fVar98 = local_fe8;
        fVar73 = fStack_fe4;
        fVar95 = fStack_fe0;
        fVar97 = fStack_fdc;
        fVar99 = local_ff8;
        fVar101 = fStack_ff4;
        fVar103 = fStack_ff0;
        fVar105 = fStack_fec;
        fVar43 = fVar72;
        fVar46 = fVar72;
        fVar62 = fVar72;
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }